

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t __n;
  int iVar1;
  int *__s;
  double *__s_00;
  long lVar2;
  float *__s_01;
  ostream *poVar3;
  ulong uVar4;
  long lVar5;
  int N;
  Vector<int> v3;
  Vector<float> v5;
  Vector<double> v4;
  Vector<int> v1;
  Vector<int> v2;
  int local_6c;
  Vector<int> local_68;
  Vector<float> local_58;
  Vector<double> local_48;
  Vector<int> local_38;
  Vector<int> local_28;
  
  local_6c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_6c);
  lVar5 = (long)local_6c;
  local_38.N = local_6c;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 4;
  }
  __s = (int *)operator_new__(uVar4);
  local_38.values = __s;
  if (0 < lVar5) {
    memset(__s,0,lVar5 * 4);
  }
  if (0 < (long)local_6c) {
    lVar5 = 0;
    do {
      __s[lVar5] = 3;
      lVar5 = lVar5 + 1;
    } while (local_6c != lVar5);
  }
  Vector<int>::Vector(&local_28,&local_38);
  Vector<int>::print(&local_28);
  iVar1 = local_6c;
  __n = (long)local_6c * 4;
  local_68.N = local_6c;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)local_6c) {
    uVar4 = __n;
  }
  local_68.values = (int *)operator_new__(uVar4);
  if (0 < iVar1) {
    memset(local_68.values,0,__n);
  }
  print<int>(&local_68);
  Vector<int>::operator=(&local_68,&local_38);
  print<int>(&local_68);
  iVar1 = local_6c;
  lVar5 = (long)local_6c;
  local_48.N = local_6c;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 8;
  }
  __s_00 = (double *)operator_new__(uVar4);
  local_48.values = __s_00;
  if (0 < iVar1) {
    memset(__s_00,0,lVar5 * 8);
    lVar2 = 0;
    do {
      __s_00[lVar2] = 3.14;
      lVar2 = lVar2 + 1;
    } while (lVar5 != lVar2);
  }
  print<double>(&local_48);
  iVar1 = local_6c;
  lVar5 = (long)local_6c;
  local_58.N = local_6c;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 4;
  }
  __s_01 = (float *)operator_new__(uVar4);
  local_58.values = __s_01;
  if (0 < iVar1) {
    memset(__s_01,0,lVar5 * 4);
    lVar2 = 0;
    do {
      __s_01[lVar2] = 3.14;
      lVar2 = lVar2 + 1;
    } while (lVar5 != lVar2);
  }
  print<float>(&local_58);
  poVar3 = std::ostream::_M_insert<double>((double)*local_58.values);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_58.values != (float *)0x0) {
    operator_delete__(local_58.values);
  }
  if (local_48.values != (double *)0x0) {
    operator_delete__(local_48.values);
  }
  if (local_68.values != (int *)0x0) {
    operator_delete__(local_68.values);
  }
  if (local_28.values != (int *)0x0) {
    operator_delete__(local_28.values);
  }
  if (local_38.values != (int *)0x0) {
    operator_delete__(local_38.values);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    // There is a std::cin object meaning console input. Use it for reading an integer from console.
    //   { int N; std::cin >> N; } defines an integer, reads an integer from the keyboard and
    //   stores it in variable "N".
    auto N = 0;
    std::cin >> N;

    // Create an "N" dimensional vector by "IntVector v1(N)" or equivalently "auto v1 = IntVector(N)".
    // If, for instance, N is entered as 5, this creates an IntVector instance that can store 5 different integer values
    //   (use new operator for dynamic memory allocation).
    auto v1 = Vector<int>(N);

    // Use v1.set(...) method for N times via a for loop to
    //   initialize the IntVector instance's contents to 1, 2, ..., N respectively.
    for(int i=0; i<N; ++i)
        v1.set(i, 3.14);

    // Use copy-constructor by "auto v2 = IntVector(v1);"
    auto v2 = Vector<int>(v1);

    // Write v2's contents by "v2.print();" (The output shall be 1, 2, 3, ..., N)
    //   where N is the number entered from the keyboard at program's start.
    v2.print();

    // Create v3 by "auto v3 = IntVector(N);". Print it "v3.print();". Result is "0, 0, ..., 0"
    auto v3 = Vector<int>(N);
    print(v3);

    //"v3 = v1; v3.print();" Result shall be 1, 2, 3, ..., N if you did everything correctly.
    v3 = v1;
    print(v3);

    auto v4 = Vector<double>(N);
    for(int i=0; i<N; ++i)
        v4.set(i, 3.14);
    print(v4);

    auto v5 = Vector<float>(N);
    for(int i=0; i<N; ++i)
        v5.set(i, 3.14f);
    print(v5);

    std::cout << v5[0] << std::endl;

    return 0;
}